

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_get_str_data_size_test(btree_kv_ops *kv_ops)

{
  char *__s;
  _func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t *p_Var1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  size_t sVar4;
  int *piVar5;
  byte bVar6;
  byte bVar7;
  bnode *pbVar8;
  void *pvVar9;
  undefined1 *puVar10;
  ulong uVar11;
  undefined1 auStackY_118 [12];
  uint16_t in_stack_fffffffffffffef4;
  uint8_t in_stack_fffffffffffffef6;
  uint8_t in_stack_fffffffffffffef7;
  int aiStack_e8 [18];
  undefined8 uStack_a0;
  size_t local_98;
  size_t size;
  void *new_minkey;
  int *value;
  char **key;
  uint8_t vsize;
  uint8_t ksize;
  uint8_t n;
  uint8_t i;
  bnode *pbStack_70;
  uint8_t v;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  uStack_a0 = 0x1033ec;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStack_a0 = 0x1033f9;
  memleak_start();
  key._5_1_ = 10;
  key._4_1_ = 8;
  key._3_1_ = 1;
  value = aiStack_e8;
  puVar10 = auStackY_118;
  new_minkey = puVar10;
  pbStack_70 = dummy_node(in_stack_fffffffffffffef7,in_stack_fffffffffffffef6,
                          in_stack_fffffffffffffef4);
  pbStack_70->nentry = 0;
  size = 0;
  for (key._6_1_ = 0; pbVar8 = pbStack_70, piVar5 = value, pvVar3 = new_minkey, sVar4 = size,
      key._6_1_ < key._5_1_; key._6_1_ = key._6_1_ + 1) {
    puVar10 = puVar10 + -(ulong)(key._4_1_ + 0xf & 0xfffffff0);
    *(undefined1 **)(value + (ulong)key._6_1_ * 2) = puVar10;
    __s = *(char **)(value + (ulong)key._6_1_ * 2);
    uVar11 = (ulong)key._6_1_;
    *(undefined8 *)(puVar10 + -8) = 0x1034bd;
    sprintf(__s,"key%d",uVar11);
    *(uint *)((long)new_minkey + (ulong)key._6_1_ * 4) = (uint)key._6_1_;
  }
  p_Var1 = kv_ops->get_data_size;
  *(undefined8 *)(puVar10 + -8) = 0x1034f9;
  local_98 = (*p_Var1)(pbVar8,(void *)sVar4,piVar5,pvVar3,2);
  if (local_98 != (long)(int)(((uint)key._4_1_ + (uint)key._3_1_) * 2)) {
    *(undefined8 *)(puVar10 + -8) = 0x10353f;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x1f7);
    kv_get_str_data_size_test::__test_pass = 0;
    if (local_98 != (long)(int)(((uint)key._4_1_ + (uint)key._3_1_) * 2)) {
      *(undefined8 *)(puVar10 + -8) = 0x103585;
      __assert_fail("size == (size_t)(2*(ksize + vsize))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x1f7,"void kv_get_str_data_size_test(btree_kv_ops *)");
    }
  }
  for (key._6_1_ = 0; pbVar8 = pbStack_70, bVar7 = key._6_1_, bVar6 = key._5_1_, piVar5 = value,
      pvVar3 = new_minkey, sVar4 = size, key._6_1_ < key._5_1_; key._6_1_ = key._6_1_ + 1) {
    p_Var2 = kv_ops->set_kv;
    pvVar3 = *(void **)(value + (ulong)key._6_1_ * 2);
    pvVar9 = (void *)((long)new_minkey + (ulong)key._6_1_ * 4);
    *(undefined8 *)(puVar10 + -8) = 0x1035cb;
    (*p_Var2)(pbVar8,(idx_t)bVar7,pvVar3,pvVar9);
  }
  pbStack_70->nentry = (ushort)key._5_1_;
  p_Var1 = kv_ops->get_data_size;
  *(undefined8 *)(puVar10 + -8) = 0x103606;
  local_98 = (*p_Var1)(pbVar8,(void *)sVar4,piVar5,pvVar3,(size_t)bVar6);
  if (local_98 != (long)(int)((uint)key._5_1_ * ((uint)key._4_1_ + (uint)key._3_1_) * 2)) {
    *(undefined8 *)(puVar10 + -8) = 0x103653;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x201);
    kv_get_str_data_size_test::__test_pass = 0;
    if (local_98 != (long)(int)((uint)key._5_1_ * ((uint)key._4_1_ + (uint)key._3_1_) * 2)) {
      *(undefined8 *)(puVar10 + -8) = 0x1036a0;
      __assert_fail("size == (size_t)(2*(n*(ksize+vsize)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x201,"void kv_get_str_data_size_test(btree_kv_ops *)");
    }
  }
  pbVar8 = pbStack_70;
  *(undefined8 *)(puVar10 + -8) = 0x1036ab;
  free(pbVar8);
  *(undefined8 *)(puVar10 + -8) = 0x1036b0;
  memleak_end();
  if (kv_get_str_data_size_test::__test_pass == 0) {
    *(undefined8 *)(puVar10 + -8) = 0x1036f9;
    fprintf(_stderr,"%s FAILED\n","kv_get_str_data_size_test");
  }
  else {
    *(undefined8 *)(puVar10 + -8) = 0x1036d8;
    fprintf(_stderr,"%s PASSED\n","kv_get_str_data_size_test");
  }
  return;
}

Assistant:

void kv_get_str_data_size_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();


    bnoderef node;
    uint8_t v;
    uint8_t i, n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    int *value = alca(int, n);
    void *new_minkey;
    size_t size;


    node = dummy_node(ksize, vsize, 1);
    node->nentry = 0;

    new_minkey = NULL;

    for (i = 0; i < n; i++){
        key[i] = alca(char, ksize);
        sprintf(key[i], "key%d", i);
        value[i] = i;
    }

    // calculate datasize to extend empty node
    size = kv_ops->get_data_size(node, new_minkey, key, value, 2);
    TEST_CHK(size == (size_t)(2*(ksize + vsize)));

    // set kvs
    for (i = 0; i < n; i++){
        kv_ops->set_kv(node, i, key[i], (void *)&value[i]);
    }

    // cacluate datasize to extend node with n entries
    node->nentry = n;
    size = kv_ops->get_data_size(node, new_minkey, key, value, n);
    TEST_CHK(size == (size_t)(2*(n*(ksize+vsize))));

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_str_data_size_test");
}